

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# non_recursive_quick_sort.c
# Opt level: O1

int main(void)

{
  int i;
  long lVar1;
  int arr [10];
  uint local_38 [10];
  
  local_38[4] = 0x1f;
  local_38[5] = 0xa3;
  local_38[6] = 0x48;
  local_38[7] = 0x5a;
  local_38[0] = 0x23;
  local_38[1] = 0x11;
  local_38[2] = 0x21;
  local_38[3] = 0x59;
  local_38[8] = 0x1a;
  local_38[9] = 0x15;
  quick_sort((int *)local_38,10);
  lVar1 = 0;
  do {
    printf("%d ",(ulong)local_38[lVar1]);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 10);
  return 0;
}

Assistant:

int main() {
  const int n = 10;
  int arr[n] = {35, 17, 33, 89, 31, 163, 72, 90, 26, 21};
  quick_sort(arr, n);
  for (int i = 0; i < n; i++) {
    printf("%d ", arr[i]);
  }

  return 0;
}